

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__tga_load(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uchar uVar4;
  byte *pbVar5;
  undefined3 uVar6;
  bool bVar7;
  byte abVar8 [4];
  stbi_uc *psVar9;
  bool bVar10;
  byte bVar11;
  int iVar12;
  uint x_00;
  uint uVar13;
  int iVar14;
  int iVar15;
  stbi_uc *psVar16;
  char *pcVar17;
  stbi_uc *psVar18;
  stbi_uc *psVar19;
  uchar *puVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  undefined7 uVar24;
  ulong __n;
  int iVar25;
  uchar *puVar26;
  ulong uVar27;
  long in_FS_OFFSET;
  bool bVar28;
  bool bVar29;
  uchar raw_data [4];
  uint local_8c;
  byte local_84 [4];
  undefined8 local_80;
  uint local_74;
  ulong local_70;
  undefined8 local_68;
  stbi_uc *local_60;
  uchar *local_58;
  uint local_4c;
  stbi_uc *local_48;
  uint local_40;
  int local_3c;
  ulong local_38;
  
  uVar6 = (undefined3)((uint)req_comp >> 8);
  psVar16 = s->img_buffer;
  psVar18 = s->img_buffer_end;
  if (psVar16 < psVar18) {
    s->img_buffer = psVar16 + 1;
    local_68 = (stbi_uc *)
               CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar16));
    psVar16 = psVar16 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_68 = (stbi_uc *)((ulong)local_68._4_4_ << 0x20);
  }
  else {
    psVar19 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar18 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_68 = (stbi_uc *)((ulong)local_68._4_4_ << 0x20);
    }
    else {
      psVar18 = psVar19 + iVar12;
      local_68 = (stbi_uc *)
                 CONCAT44(local_68._4_4_,(int)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar19));
    }
    s->img_buffer_end = psVar18;
    psVar16 = s->buffer_start + 1;
    s->img_buffer = psVar16;
  }
  if (psVar16 < psVar18) {
    s->img_buffer = psVar16 + 1;
    bVar1 = *psVar16;
    psVar16 = psVar16 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    bVar1 = 0;
  }
  else {
    psVar16 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar16,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar18 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar1 = 0;
    }
    else {
      psVar18 = psVar16 + iVar12;
      bVar1 = *psVar16;
    }
    s->img_buffer_end = psVar18;
    psVar16 = s->buffer_start + 1;
    s->img_buffer = psVar16;
  }
  if (psVar16 < psVar18) {
    s->img_buffer = psVar16 + 1;
    bVar2 = *psVar16;
  }
  else if (s->read_from_callbacks == 0) {
    bVar2 = 0;
  }
  else {
    psVar18 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar16 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar2 = 0;
    }
    else {
      psVar16 = psVar18 + iVar12;
      bVar2 = *psVar18;
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = s->buffer_start + 1;
  }
  iVar12 = stbi__get16le(s);
  local_4c = stbi__get16le(s);
  psVar18 = s->img_buffer;
  local_60 = (stbi_uc *)CONCAT44(local_60._4_4_,iVar12);
  local_80 = (uint *)comp;
  local_3c = req_comp;
  if (psVar18 < s->img_buffer_end) {
    s->img_buffer = psVar18 + 1;
    uVar22 = (ulong)CONCAT31(uVar6,*psVar18);
  }
  else if (s->read_from_callbacks == 0) {
    uVar22 = 0;
  }
  else {
    psVar18 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar16 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      uVar22 = 0;
    }
    else {
      psVar16 = psVar18 + iVar12;
      uVar22 = (ulong)CONCAT31(uVar6,*psVar18);
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = s->buffer_start + 1;
  }
  stbi__get16le(s);
  stbi__get16le(s);
  x_00 = stbi__get16le(s);
  uVar13 = stbi__get16le(s);
  local_70 = (ulong)uVar13;
  psVar16 = s->img_buffer;
  psVar18 = s->img_buffer_end;
  if (psVar16 < psVar18) {
    s->img_buffer = psVar16 + 1;
    local_8c = (uint)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar16);
    psVar16 = psVar16 + 1;
  }
  else if (s->read_from_callbacks == 0) {
    local_8c = 0;
  }
  else {
    psVar19 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar19,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar18 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      local_8c = 0;
    }
    else {
      psVar18 = psVar19 + iVar12;
      local_8c = (uint)CONCAT71((int7)((ulong)psVar16 >> 8),*psVar19);
    }
    s->img_buffer_end = psVar18;
    psVar16 = s->buffer_start + 1;
    s->img_buffer = psVar16;
    uVar13 = (uint)local_70;
  }
  if (psVar16 < psVar18) {
    s->img_buffer = psVar16 + 1;
    bVar3 = *psVar16;
  }
  else if (s->read_from_callbacks == 0) {
    bVar3 = 0;
  }
  else {
    psVar18 = s->buffer_start;
    iVar12 = (*(s->io).read)(s->io_user_data,(char *)psVar18,s->buflen);
    if (iVar12 == 0) {
      s->read_from_callbacks = 0;
      psVar16 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar3 = 0;
    }
    else {
      psVar16 = psVar18 + iVar12;
      bVar3 = *psVar18;
    }
    s->img_buffer_end = psVar16;
    s->img_buffer = s->buffer_start + 1;
    uVar13 = (uint)local_70;
  }
  local_84[0] = 0;
  local_84[1] = 0;
  local_84[2] = 0;
  local_84[3] = 0;
  uVar24 = (undefined7)(uVar22 >> 8);
  if (bVar1 == 0) {
    uVar21 = local_8c & 0xff;
    if ((local_8c & 0xff) < 0x10) {
      if ((local_8c & 0xff) == 8) {
LAB_0015987e:
        bVar29 = true;
        bVar7 = false;
        uVar21 = (uint)CONCAT71(uVar24,1);
        goto LAB_001598b3;
      }
      if (uVar21 == 0xf) goto LAB_0015986b;
    }
    else {
      if ((uVar21 == 0x20) || (uVar21 == 0x18)) {
        uVar22 = (ulong)local_8c;
        goto LAB_001598a1;
      }
      if (uVar21 == 0x10) {
        uVar21 = bVar2 - 8;
        if (bVar2 < 8) {
          uVar21 = (uint)bVar2;
        }
        if (uVar21 != 3) goto LAB_0015986b;
        uVar21 = (uint)CONCAT71(uVar24,2);
        goto LAB_001598a5;
      }
    }
LAB_00159891:
    pcVar17 = "Can\'t find out TGA pixelformat";
    goto LAB_00159ec3;
  }
  uVar21 = (uint)uVar22 & 0xff;
  if (uVar21 < 0x18) {
    if (1 < uVar21 - 0xf) {
      if (uVar21 == 8) goto LAB_0015987e;
      goto LAB_00159891;
    }
LAB_0015986b:
    uVar21 = (uint)CONCAT71(uVar24,3);
    bVar7 = true;
    bVar29 = false;
  }
  else {
    if ((uVar21 != 0x18) && (uVar21 != 0x20)) goto LAB_00159891;
LAB_001598a1:
    uVar21 = (uint)CONCAT71((int7)(uVar22 >> 8),(byte)uVar22 >> 3);
LAB_001598a5:
    bVar29 = true;
    bVar7 = false;
  }
LAB_001598b3:
  uVar23 = uVar21 & 0xff;
  *x = x_00;
  *y = uVar13;
  if (local_80 != (uint *)0x0) {
    *local_80 = uVar23;
  }
  local_40 = uVar21;
  iVar12 = stbi__mad3sizes_valid(x_00,uVar13,uVar23,0);
  if (iVar12 == 0) {
LAB_00159ebc:
    pcVar17 = "Corrupt TGA";
    goto LAB_00159ec3;
  }
  local_58 = (uchar *)stbi__malloc_mad3(x_00,uVar13,uVar23,0);
  if (local_58 == (uchar *)0x0) {
LAB_00159a16:
    pcVar17 = "Out of memory";
LAB_00159ec3:
    *(char **)(in_FS_OFFSET + -0x10) = pcVar17;
    return (void *)0x0;
  }
  stbi__skip(s,(uint)(byte)local_68);
  puVar20 = local_58;
  local_80 = (uint *)(CONCAT44(local_80._4_4_,uVar21) & 0xffffffff000000ff);
  iVar12 = (int)local_70;
  if ((bVar2 < 8 && bVar1 == 0) && !bVar7) {
    if ((int)local_70 != 0) {
      iVar14 = x_00 * (int)local_80;
      iVar25 = 0;
      do {
        iVar12 = iVar12 + -1;
        iVar15 = iVar25;
        if ((bVar3 >> 5 & 1) == 0) {
          iVar15 = iVar12;
        }
        stbi__getn(s,puVar20 + iVar15 * iVar14,iVar14);
        iVar25 = iVar25 + 1;
      } while (iVar12 != 0);
    }
    goto LAB_00159e42;
  }
  if (bVar1 == 0) {
    local_48 = (stbi_uc *)0x0;
  }
  else {
    stbi__skip(s,(int)local_60);
    uVar13 = local_4c;
    psVar18 = (stbi_uc *)stbi__malloc_mad2(local_4c,uVar23,0);
    if (psVar18 == (stbi_uc *)0x0) {
      free(local_58);
      goto LAB_00159a16;
    }
    local_48 = psVar18;
    if (bVar29) {
      iVar14 = stbi__getn(s,psVar18,uVar13 * uVar23);
      if (iVar14 == 0) {
        free(local_58);
        free(psVar18);
        goto LAB_00159ebc;
      }
    }
    else if (uVar13 != 0) {
      psVar18 = psVar18 + 2;
      do {
        uVar21 = stbi__get16le(s);
        psVar18[-2] = (stbi_uc)(((uVar21 >> 10 & 0x1f) * 0xff) / 0x1f);
        psVar18[-1] = (stbi_uc)(((uVar21 >> 5 & 0x1f) * 0xff) / 0x1f);
        *psVar18 = (stbi_uc)(((uVar21 & 0x1f) * 0xff) / 0x1f);
        psVar18 = psVar18 + uVar23;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
      iVar12 = (int)local_70;
    }
  }
  if (iVar12 * x_00 != 0) {
    local_68 = s->buffer_start;
    psVar18 = s->buffer_start + 1;
    __n = (ulong)local_80 & 0xffffffff;
    local_38 = (ulong)(iVar12 * x_00);
    bVar10 = true;
    uVar22 = 0;
    local_74 = 0;
    iVar12 = 0;
    local_60 = psVar18;
    do {
      psVar16 = local_68;
      if (bVar2 < 8) {
LAB_00159ba2:
        psVar16 = local_68;
        if (bVar1 == 0) {
          if (bVar29) {
            if ((int)local_80 == 0) goto LAB_00159dae;
            psVar16 = s->img_buffer;
            psVar19 = s->img_buffer_end;
            uVar27 = 0;
            do {
              psVar9 = local_68;
              if (psVar16 < psVar19) {
                s->img_buffer = psVar16 + 1;
                bVar11 = *psVar16;
                psVar16 = psVar16 + 1;
              }
              else if (s->read_from_callbacks == 0) {
                bVar11 = 0;
              }
              else {
                iVar14 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
                if (iVar14 == 0) {
                  s->read_from_callbacks = 0;
                  s->buffer_start[0] = '\0';
                  bVar11 = 0;
                  psVar19 = local_60;
                }
                else {
                  bVar11 = *psVar9;
                  psVar19 = psVar9 + iVar14;
                }
                s->img_buffer_end = psVar19;
                s->img_buffer = local_60;
                psVar16 = local_60;
                psVar18 = local_60;
              }
              local_84[uVar27] = bVar11;
              uVar27 = uVar27 + 1;
            } while (__n != uVar27);
          }
          else {
            uVar13 = stbi__get16le(s);
            abVar8 = local_84;
            local_84[1] = (char)(((uVar13 >> 5 & 0x1f) * 0xff) / 0x1f);
            local_84[0] = (char)(((uVar13 >> 10 & 0x1f) * 0xff) / 0x1f);
            local_84[3] = abVar8[3];
            local_84[2] = (char)(((uVar13 & 0x1f) * 0xff) / 0x1f);
          }
          goto LAB_00159cf5;
        }
        if ((char)local_8c == '\b') {
          pbVar5 = s->img_buffer;
          if (pbVar5 < s->img_buffer_end) {
            s->img_buffer = pbVar5 + 1;
            bVar11 = *pbVar5;
          }
          else if (s->read_from_callbacks == 0) {
            bVar11 = 0;
          }
          else {
            iVar14 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
            if (iVar14 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar11 = 0;
              psVar18 = local_60;
            }
            else {
              bVar11 = *psVar16;
              psVar18 = psVar16 + iVar14;
            }
            s->img_buffer_end = psVar18;
            s->img_buffer = local_60;
            psVar18 = local_60;
          }
          uVar13 = (uint)bVar11;
        }
        else {
          uVar13 = stbi__get16le(s);
        }
        if ((int)local_80 != 0) {
          if (local_4c <= uVar13) {
            uVar13 = 0;
          }
          memcpy(local_84,local_48 + uVar13 * (int)local_80,__n);
          goto LAB_00159d93;
        }
      }
      else {
        if (iVar12 == 0) {
          pbVar5 = s->img_buffer;
          if (pbVar5 < s->img_buffer_end) {
            s->img_buffer = pbVar5 + 1;
            bVar11 = *pbVar5;
          }
          else if (s->read_from_callbacks == 0) {
            bVar11 = 0;
          }
          else {
            iVar12 = (*(s->io).read)(s->io_user_data,(char *)local_68,s->buflen);
            if (iVar12 == 0) {
              s->read_from_callbacks = 0;
              s->buffer_start[0] = '\0';
              bVar11 = 0;
              psVar16 = psVar18;
            }
            else {
              bVar11 = *psVar16;
              psVar16 = psVar16 + iVar12;
            }
            s->img_buffer_end = psVar16;
            s->img_buffer = psVar18;
          }
          iVar12 = (bVar11 & 0x7f) + 1;
          local_74 = (uint)(bVar11 >> 7);
          goto LAB_00159ba2;
        }
        bVar28 = local_74 != 0;
        local_74 = 1;
        if (!bVar28 || bVar10) {
          local_74 = (uint)bVar28;
          goto LAB_00159ba2;
        }
LAB_00159cf5:
        if ((int)local_80 != 0) {
LAB_00159d93:
          memcpy(local_58 + (uint)((int)local_80 * (int)uVar22),local_84,__n);
        }
      }
LAB_00159dae:
      iVar12 = iVar12 + -1;
      uVar22 = uVar22 + 1;
      bVar10 = false;
    } while (uVar22 != local_38);
  }
  puVar20 = local_58;
  if ((bVar3 >> 5 & 1) == 0 && (int)local_70 != 0) {
    iVar12 = x_00 * (int)local_80;
    uVar21 = (int)local_70 - 1;
    iVar14 = iVar12 * uVar21;
    uVar23 = 0;
    uVar13 = 0;
    do {
      if (iVar12 != 0) {
        puVar26 = local_58;
        iVar25 = iVar12 + 1;
        do {
          uVar4 = puVar26[uVar23];
          puVar26[uVar23] = puVar26[iVar14];
          puVar26[iVar14] = uVar4;
          puVar26 = puVar26 + 1;
          iVar25 = iVar25 + -1;
        } while (1 < iVar25);
      }
      iVar14 = iVar14 - iVar12;
      uVar23 = uVar23 + iVar12;
      bVar29 = uVar13 != uVar21 >> 1;
      uVar13 = uVar13 + 1;
    } while (bVar29);
  }
  if (local_48 != (stbi_uc *)0x0) {
    free(local_48);
  }
LAB_00159e42:
  if ((!bVar7 && 2 < (byte)local_40) && (iVar12 = (uint)local_70 * x_00, iVar12 != 0)) {
    puVar26 = puVar20 + 2;
    do {
      uVar4 = puVar26[-2];
      puVar26[-2] = *puVar26;
      *puVar26 = uVar4;
      puVar26 = puVar26 + ((ulong)local_80 & 0xffffffff);
      iVar12 = iVar12 + -1;
    } while (iVar12 != 0);
  }
  if (local_3c == 0) {
    return puVar20;
  }
  if ((int)local_80 == local_3c) {
    return puVar20;
  }
  puVar20 = stbi__convert_format(puVar20,(int)local_80,local_3c,x_00,(uint)local_70);
  return puVar20;
}

Assistant:

static void *stbi__tga_load(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri)
{
   //   read in the TGA header stuff
   int tga_offset = stbi__get8(s);
   int tga_indexed = stbi__get8(s);
   int tga_image_type = stbi__get8(s);
   int tga_is_RLE = 0;
   int tga_palette_start = stbi__get16le(s);
   int tga_palette_len = stbi__get16le(s);
   int tga_palette_bits = stbi__get8(s);
   int tga_x_origin = stbi__get16le(s);
   int tga_y_origin = stbi__get16le(s);
   int tga_width = stbi__get16le(s);
   int tga_height = stbi__get16le(s);
   int tga_bits_per_pixel = stbi__get8(s);
   int tga_comp, tga_rgb16=0;
   int tga_inverted = stbi__get8(s);
   // int tga_alpha_bits = tga_inverted & 15; // the 4 lowest bits - unused (useless?)
   //   image data
   unsigned char *tga_data;
   unsigned char *tga_palette = NULL;
   int i, j;
   unsigned char raw_data[4] = {0};
   int RLE_count = 0;
   int RLE_repeating = 0;
   int read_next_pixel = 1;
   STBI_NOTUSED(ri);
   STBI_NOTUSED(tga_x_origin); // @TODO
   STBI_NOTUSED(tga_y_origin); // @TODO

   //   do a tiny bit of precessing
   if ( tga_image_type >= 8 )
   {
      tga_image_type -= 8;
      tga_is_RLE = 1;
   }
   tga_inverted = 1 - ((tga_inverted >> 5) & 1);

   //   If I'm paletted, then I'll use the number of bits from the palette
   if ( tga_indexed ) tga_comp = stbi__tga_get_comp(tga_palette_bits, 0, &tga_rgb16);
   else tga_comp = stbi__tga_get_comp(tga_bits_per_pixel, (tga_image_type == 3), &tga_rgb16);

   if(!tga_comp) // shouldn't really happen, stbi__tga_test() should have ensured basic consistency
      return stbi__errpuc("bad format", "Can't find out TGA pixelformat");

   //   tga info
   *x = tga_width;
   *y = tga_height;
   if (comp) *comp = tga_comp;

   if (!stbi__mad3sizes_valid(tga_width, tga_height, tga_comp, 0))
      return stbi__errpuc("too large", "Corrupt TGA");

   tga_data = (unsigned char*)stbi__malloc_mad3(tga_width, tga_height, tga_comp, 0);
   if (!tga_data) return stbi__errpuc("outofmem", "Out of memory");

   // skip to the data's starting position (offset usually = 0)
   stbi__skip(s, tga_offset );

   if ( !tga_indexed && !tga_is_RLE && !tga_rgb16 ) {
      for (i=0; i < tga_height; ++i) {
         int row = tga_inverted ? tga_height -i - 1 : i;
         stbi_uc *tga_row = tga_data + row*tga_width*tga_comp;
         stbi__getn(s, tga_row, tga_width * tga_comp);
      }
   } else  {
      //   do I need to load a palette?
      if ( tga_indexed)
      {
         //   any data to skip? (offset usually = 0)
         stbi__skip(s, tga_palette_start );
         //   load the palette
         tga_palette = (unsigned char*)stbi__malloc_mad2(tga_palette_len, tga_comp, 0);
         if (!tga_palette) {
            STBI_FREE(tga_data);
            return stbi__errpuc("outofmem", "Out of memory");
         }
         if (tga_rgb16) {
            stbi_uc *pal_entry = tga_palette;
            STBI_ASSERT(tga_comp == STBI_rgb);
            for (i=0; i < tga_palette_len; ++i) {
               stbi__tga_read_rgb16(s, pal_entry);
               pal_entry += tga_comp;
            }
         } else if (!stbi__getn(s, tga_palette, tga_palette_len * tga_comp)) {
               STBI_FREE(tga_data);
               STBI_FREE(tga_palette);
               return stbi__errpuc("bad palette", "Corrupt TGA");
         }
      }
      //   load the data
      for (i=0; i < tga_width * tga_height; ++i)
      {
         //   if I'm in RLE mode, do I need to get a RLE stbi__pngchunk?
         if ( tga_is_RLE )
         {
            if ( RLE_count == 0 )
            {
               //   yep, get the next byte as a RLE command
               int RLE_cmd = stbi__get8(s);
               RLE_count = 1 + (RLE_cmd & 127);
               RLE_repeating = RLE_cmd >> 7;
               read_next_pixel = 1;
            } else if ( !RLE_repeating )
            {
               read_next_pixel = 1;
            }
         } else
         {
            read_next_pixel = 1;
         }
         //   OK, if I need to read a pixel, do it now
         if ( read_next_pixel )
         {
            //   load however much data we did have
            if ( tga_indexed )
            {
               // read in index, then perform the lookup
               int pal_idx = (tga_bits_per_pixel == 8) ? stbi__get8(s) : stbi__get16le(s);
               if ( pal_idx >= tga_palette_len ) {
                  // invalid index
                  pal_idx = 0;
               }
               pal_idx *= tga_comp;
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = tga_palette[pal_idx+j];
               }
            } else if(tga_rgb16) {
               STBI_ASSERT(tga_comp == STBI_rgb);
               stbi__tga_read_rgb16(s, raw_data);
            } else {
               //   read in the data raw
               for (j = 0; j < tga_comp; ++j) {
                  raw_data[j] = stbi__get8(s);
               }
            }
            //   clear the reading flag for the next pixel
            read_next_pixel = 0;
         } // end of reading a pixel

         // copy data
         for (j = 0; j < tga_comp; ++j)
           tga_data[i*tga_comp+j] = raw_data[j];

         //   in case we're in RLE mode, keep counting down
         --RLE_count;
      }
      //   do I need to invert the image?
      if ( tga_inverted )
      {
         for (j = 0; j*2 < tga_height; ++j)
         {
            int index1 = j * tga_width * tga_comp;
            int index2 = (tga_height - 1 - j) * tga_width * tga_comp;
            for (i = tga_width * tga_comp; i > 0; --i)
            {
               unsigned char temp = tga_data[index1];
               tga_data[index1] = tga_data[index2];
               tga_data[index2] = temp;
               ++index1;
               ++index2;
            }
         }
      }
      //   clear my palette, if I had one
      if ( tga_palette != NULL )
      {
         STBI_FREE( tga_palette );
      }
   }

   // swap RGB - if the source data was RGB16, it already is in the right order
   if (tga_comp >= 3 && !tga_rgb16)
   {
      unsigned char* tga_pixel = tga_data;
      for (i=0; i < tga_width * tga_height; ++i)
      {
         unsigned char temp = tga_pixel[0];
         tga_pixel[0] = tga_pixel[2];
         tga_pixel[2] = temp;
         tga_pixel += tga_comp;
      }
   }

   // convert to target component count
   if (req_comp && req_comp != tga_comp)
      tga_data = stbi__convert_format(tga_data, tga_comp, req_comp, tga_width, tga_height);

   //   the things I do to get rid of an error message, and yet keep
   //   Microsoft's C compilers happy... [8^(
   tga_palette_start = tga_palette_len = tga_palette_bits =
         tga_x_origin = tga_y_origin = 0;
   STBI_NOTUSED(tga_palette_start);
   //   OK, done
   return tga_data;
}